

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O2

void anon_unknown.dwarf_11de82::fillPixels1(Array2D<Imf_2_5::Rgba> *pixels,int w,int h)

{
  Rgba *pRVar1;
  int x;
  long lVar2;
  int y;
  long lVar3;
  long lVar4;
  long lVar5;
  long local_38;
  
  local_38 = 0;
  for (lVar3 = 0; lVar3 != 0xed; lVar3 = lVar3 + 1) {
    lVar4 = 0;
    for (lVar2 = 0; lVar2 != 0x77; lVar2 = lVar2 + 1) {
      lVar5 = pixels->_sizeY * local_38;
      pRVar1 = pixels->_data;
      half::operator=((half *)((long)&(pRVar1->r)._h + lVar4 + lVar5),(float)((uint)lVar2 & 1));
      half::operator=((half *)((long)&(pRVar1->g)._h + lVar4 + lVar5),
                      (float)((uint)lVar3 + (uint)lVar2 & 1));
      half::operator=((half *)((long)&(pRVar1->b)._h + lVar4 + lVar5),(float)((uint)lVar3 & 1));
      half::operator=((half *)((long)&(pRVar1->a)._h + lVar4 + lVar5),
                      (*(float *)((long)&half::_toFloat +
                                 (ulong)*(unsigned_short *)((long)&pRVar1[lVar2].r._h + lVar5) * 4)
                       + *(float *)((long)&half::_toFloat +
                                   (ulong)*(unsigned_short *)((long)&pRVar1[lVar2].b._h + lVar5) * 4
                                   ) +
                      *(float *)((long)&half::_toFloat +
                                (ulong)*(unsigned_short *)((long)&pRVar1[lVar2].g._h + lVar5) * 4))
                      / 3.0);
      lVar4 = lVar4 + 8;
    }
    local_38 = local_38 + 8;
  }
  return;
}

Assistant:

void
fillPixels1 (Array2D<Rgba> &pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
	for (int x = 0; x < w; ++x)
	{
	    Rgba &p = pixels[y][x];

	    p.r = (x & 1);
	    p.g = ((x + y) & 1);
	    p.b = (y & 1);
	    p.a = (p.r + p.b + p.g) / 3.0;
	}
    }
}